

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EventTriggerStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EventTriggerStatementSyntax,slang::syntax::SyntaxKind&,slang::syntax::NamedLabelSyntax*&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::TimingControlSyntax*&,slang::syntax::NameSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,NamedLabelSyntax **args_1,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_2,Token *args_3,
          TimingControlSyntax **args_4,NameSyntax *args_5,Token *args_6)

{
  Token trigger;
  Token semi;
  EventTriggerStatementSyntax *pEVar1;
  undefined8 in_RCX;
  Info *in_RDX;
  NameSyntax *in_R8;
  TimingControlSyntax *in_R9;
  undefined8 *in_stack_00000010;
  size_t in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  BumpAllocator *in_stack_ffffffffffffffa8;
  
  pEVar1 = (EventTriggerStatementSyntax *)
           allocate(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  trigger.info = *(Info **)&(in_R8->super_ExpressionSyntax).super_SyntaxNode;
  trigger._0_8_ = (NamedLabelSyntax *)in_stack_00000010[1];
  semi.info = in_RDX;
  semi.kind = (short)in_RCX;
  semi._2_1_ = (char)((ulong)in_RCX >> 0x10);
  semi.numFlags.raw = (char)((ulong)in_RCX >> 0x18);
  semi.rawLen = (int)((ulong)in_RCX >> 0x20);
  slang::syntax::EventTriggerStatementSyntax::EventTriggerStatementSyntax
            ((EventTriggerStatementSyntax *)*in_stack_00000010,(SyntaxKind)((ulong)pEVar1 >> 0x20),
             (NamedLabelSyntax *)in_stack_00000010[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000010,trigger,in_R9,
             in_R8,semi);
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }